

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O0

void boost::algorithm::trim_left_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  is_any_ofF<char> local_58;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  
  local_20 = (char *)range_adl_barrier::begin<std::__cxx11::string>(in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff68);
  local_38 = (char *)range_adl_barrier::begin<std::__cxx11::string>(in_stack_ffffffffffffff68);
  local_40 = (char *)range_adl_barrier::end<std::__cxx11::string>(in_stack_ffffffffffffff68);
  detail::is_any_ofF<char>::is_any_ofF(&local_58,(is_any_ofF<char> *)in_RSI._M_current);
  local_30 = (char *)detail::
                     trim_begin<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::algorithm::detail::is_any_ofF<char>>
                               (in_RSI,in_RDI,(is_any_ofF<char> *)in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff68);
  std::__cxx11::string::erase(in_RDI._M_current,local_18,local_28);
  detail::is_any_ofF<char>::~is_any_ofF((is_any_ofF<char> *)in_RDI._M_current);
  return;
}

Assistant:

inline void trim_left_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase( 
                ::boost::begin(Input),
                ::boost::algorithm::detail::trim_begin( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace));
        }